

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O0

bool __thiscall
CDBIterator::GetKey<(anonymous_namespace)::DBHeightKey>(CDBIterator *this,DBHeightKey *key)

{
  long lVar1;
  long in_FS_OFFSET;
  Span<const_std::byte> SVar2;
  exception *anon_var_0;
  DataStream ssKey;
  DataStream *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  CDBIterator *in_stack_ffffffffffffff88;
  Span<const_std::byte> in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SVar2 = GetKeyImpl(in_stack_ffffffffffffff88);
  DataStream::DataStream((DataStream *)SVar2.m_data,in_stack_ffffffffffffffa0);
  DataStream::operator>>
            ((DataStream *)SVar2.m_size,
             (DBHeightKey *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  DataStream::~DataStream(in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool GetKey(K& key) {
        try {
            DataStream ssKey{GetKeyImpl()};
            ssKey >> key;
        } catch (const std::exception&) {
            return false;
        }
        return true;
    }